

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

void basist::encode_bc7_block(void *pBlock,bc7_optimization_results *pResults)

{
  uint8_t uVar1;
  undefined4 uVar2;
  char cVar3;
  undefined1 *puVar4;
  uint8_t *puVar5;
  byte bVar6;
  uint32_t i;
  byte *pbVar7;
  long lVar8;
  uint32_t uVar9;
  uint uVar10;
  color_quad_u8 *pcVar11;
  uint32_t comp;
  ulong uVar12;
  uint32_t subset;
  uint uVar13;
  ulong uVar14;
  color_quad_u8 *pcVar15;
  uint32_t k;
  ulong uVar16;
  uint8_t *puVar17;
  uint32_t x;
  ulong uVar18;
  uint8_t *puVar19;
  uint32_t auVar20 [2];
  uint32_t cur_bit_ofs;
  ulong local_e8;
  ulong local_e0;
  uint local_d4;
  ulong local_d0;
  uint8_t *local_c8;
  ulong local_c0;
  ulong local_b8;
  uint local_b0;
  color_quad_u8 high [3];
  color_quad_u8 low [3];
  uint8_t alpha_selectors [16];
  uint8_t color_selectors [16];
  ulong local_68;
  uint32_t pbits [3] [2];
  
  uVar10 = pResults->m_mode;
  local_e8 = (ulong)uVar10;
  local_d0 = (ulong)*(byte *)((long)&g_bc7_num_subsets + local_e8);
  uVar14 = local_e8 - 4;
  if (uVar14 < 3) {
    puVar4 = &g_bc7_partition1;
  }
  else {
    uVar13 = pResults->m_partition << 4;
    if ((0x8aUL >> (local_e8 & 0x3f) & 1) == 0) {
      puVar4 = g_bc7_partition3 + uVar13;
    }
    else {
      puVar4 = g_bc7_partition2 + uVar13;
    }
  }
  local_e0 = (ulong)(int)uVar10;
  color_selectors._0_8_ = *(undefined8 *)pResults->m_selectors;
  color_selectors._8_8_ = *(undefined8 *)(pResults->m_selectors + 8);
  alpha_selectors._0_8_ = *(undefined8 *)pResults->m_alpha_selectors;
  alpha_selectors._8_8_ = *(undefined8 *)(pResults->m_alpha_selectors + 8);
  pcVar11 = low;
  low._0_8_ = *(undefined8 *)pResults->m_low;
  low[2].m_c = *&pResults->m_low[2].m_c;
  pcVar15 = high;
  high._0_8_ = *(undefined8 *)pResults->m_high;
  high[2].m_c = *&pResults->m_high[2].m_c;
  pbits[2] = pResults->m_pbits[2];
  pbits[0] = pResults->m_pbits[0];
  pbits[1] = pResults->m_pbits[1];
  local_b0 = 0xffffffff;
  local_b8 = 0xffffffffffffffff;
  local_d4 = uVar10 & 0xfffffffe;
  uVar16 = 0;
  do {
    if (uVar16 == local_d0) {
      *(undefined1 (*) [16])pBlock = (undefined1  [16])0x0;
      cur_bit_ofs = 0;
      local_c8 = (uint8_t *)pBlock;
      bc7_set_block_bits((uint8_t *)pBlock,1 << ((byte)uVar10 & 0x1f),uVar10 + 1,&cur_bit_ofs);
      if (local_d4 == 4) {
        bc7_set_block_bits((uint8_t *)pBlock,pResults->m_rotation,2,&cur_bit_ofs);
        if ((uint)local_e8 == 4) {
          bc7_set_block_bits((uint8_t *)pBlock,pResults->m_index_selector,1,&cur_bit_ofs);
        }
      }
      if (2 < uVar14) {
        bc7_set_block_bits((uint8_t *)pBlock,pResults->m_partition,
                           (uint)((0x8eUL >> (local_e8 & 0x3f) & 1) != 0) * 2 + 4,&cur_bit_ofs);
      }
      local_c0 = 4 - (ulong)((uint)local_e8 < 4);
      puVar19 = low[0].m_c;
      puVar17 = high[0].m_c;
      for (lVar8 = 0; lVar8 != local_c0; lVar8 = lVar8 + 1) {
        for (uVar14 = 0; local_d0 != uVar14; uVar14 = uVar14 + 1) {
          if (lVar8 == 3) {
            uVar9 = (uint32_t)*(char *)((long)&g_bc7_alpha_precision_table + local_e8);
          }
          else {
            uVar9 = (uint32_t)*(byte *)((long)&g_bc7_color_precision_table + local_e8);
          }
          bc7_set_block_bits((uint8_t *)pBlock,(uint)puVar19[uVar14 * 4],uVar9,&cur_bit_ofs);
          if (lVar8 == 3) {
            uVar9 = (uint32_t)*(char *)((long)&g_bc7_alpha_precision_table + local_e8);
          }
          else {
            uVar9 = (uint32_t)*(byte *)((long)&g_bc7_color_precision_table + local_e8);
          }
          bc7_set_block_bits((uint8_t *)pBlock,(uint)puVar17[uVar14 * 4],uVar9,&cur_bit_ofs);
        }
        puVar19 = puVar19 + 1;
        puVar17 = puVar17 + 1;
      }
      if ((0x34UL >> (local_e8 & 0x3f) & 1) == 0) {
        for (uVar14 = 0; local_d0 != uVar14; uVar14 = uVar14 + 1) {
          bc7_set_block_bits((uint8_t *)pBlock,pbits[uVar14][0],1,&cur_bit_ofs);
          if ((int)local_e0 != 1) {
            bc7_set_block_bits((uint8_t *)pBlock,pbits[uVar14][1],1,&cur_bit_ofs);
          }
        }
      }
      uVar12 = local_b8 & 0xffffffff;
      uVar14 = local_b8 >> 0x20;
      local_68 = (ulong)local_b0;
      puVar19 = alpha_selectors;
      puVar17 = color_selectors;
      uVar16 = local_68;
      local_d0 = uVar12;
      local_c0 = uVar14;
      for (lVar8 = 0; uVar18 = local_e8, lVar8 != 4; lVar8 = lVar8 + 1) {
        for (uVar18 = 0; uVar18 != 4; uVar18 = uVar18 + 1) {
          uVar9 = pResults->m_index_selector;
          if (uVar9 == 0) {
            uVar10 = (uint)*(byte *)((long)&g_bc7_color_index_bitcount + local_e0);
          }
          else {
            uVar10 = *(byte *)((long)&g_bc7_alpha_index_bitcount + local_e0) - uVar9;
          }
          puVar5 = puVar19;
          if (uVar9 == 0) {
            puVar5 = puVar17;
          }
          bc7_set_block_bits(local_c8,(uint)puVar5[uVar18],
                             uVar10 - (uVar16 == uVar18 || (uVar14 == uVar18 || uVar12 == uVar18)),
                             &cur_bit_ofs);
        }
        uVar16 = uVar16 - 4;
        uVar14 = uVar14 - 4;
        uVar12 = uVar12 - 4;
        puVar19 = puVar19 + 4;
        puVar17 = puVar17 + 4;
      }
      if (local_d4 == 4) {
        puVar17 = color_selectors;
        puVar19 = alpha_selectors;
        uVar14 = 0;
        while (uVar14 != 4) {
          local_e0 = uVar14;
          for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
            uVar9 = pResults->m_index_selector;
            if (uVar9 == 0) {
              uVar10 = (uint)*(byte *)((long)&g_bc7_alpha_index_bitcount + uVar18);
            }
            else {
              uVar10 = *(byte *)((long)&g_bc7_color_index_bitcount + uVar18) + uVar9;
            }
            puVar5 = puVar17;
            if (uVar9 == 0) {
              puVar5 = puVar19;
            }
            bc7_set_block_bits(local_c8,(uint)puVar5[uVar16],
                               uVar10 - (local_68 == uVar16 ||
                                        (local_c0 == uVar16 || local_d0 == uVar16)),&cur_bit_ofs);
          }
          local_68 = local_68 - 4;
          local_c0 = local_c0 - 4;
          local_d0 = local_d0 - 4;
          puVar17 = puVar17 + 4;
          puVar19 = puVar19 + 4;
          uVar14 = local_e0 + 1;
        }
      }
      if (cur_bit_ofs == 0x80) {
        return;
      }
      __assert_fail("cur_bit_ofs == 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2da4,
                    "void basist::encode_bc7_block(void *, const bc7_optimization_results *)");
    }
    if (uVar16 == 0) {
      bVar6 = 0;
    }
    else {
      if (uVar16 == 1 && (local_e0 & 0xfffffffd) == 0) {
        pbVar7 = g_bc7_table_anchor_index_third_subset_1 + pResults->m_partition;
      }
      else if (uVar16 == 2 && (local_e0 & 0xfffffffd) == 0) {
        pbVar7 = g_bc7_table_anchor_index_third_subset_2 + pResults->m_partition;
      }
      else {
        pbVar7 = g_bc7_table_anchor_index_second_subset + pResults->m_partition;
      }
      bVar6 = *pbVar7;
    }
    *(uint *)((long)&local_b8 + uVar16 * 4) = (uint)bVar6;
    cVar3 = (char)pResults->m_index_selector;
    uVar13 = 1 << (*(char *)((long)&g_bc7_color_index_bitcount + local_e0) + cVar3 & 0x1fU);
    if ((uVar13 >> 1 & (uint)color_selectors[bVar6]) == 0) {
LAB_001627f0:
      if ((local_d4 == 4) &&
         (uVar13 = 1 << (*(char *)((long)&g_bc7_alpha_index_bitcount + local_e0) - cVar3 & 0x1fU),
         (uVar13 >> 1 & (uint)alpha_selectors[bVar6]) != 0)) {
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
          if (uVar16 == (byte)puVar4[lVar8]) {
            alpha_selectors[lVar8] = ~alpha_selectors[lVar8] + (char)uVar13;
          }
        }
        uVar1 = low[uVar16].m_c[3];
        low[uVar16].m_c[3] = high[uVar16].m_c[3];
        high[uVar16].m_c[3] = uVar1;
      }
    }
    else {
      for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
        if (uVar16 == (byte)puVar4[lVar8]) {
          color_selectors[lVar8] = ~color_selectors[lVar8] + (char)uVar13;
        }
      }
      if (local_d4 == 4) {
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          uVar1 = pcVar11->m_c[lVar8];
          pcVar11->m_c[lVar8] = pcVar15->m_c[lVar8];
          pcVar15->m_c[lVar8] = uVar1;
        }
      }
      else {
        uVar2 = *(undefined4 *)low[uVar16].m_c;
        *(undefined4 *)low[uVar16].m_c = *(undefined4 *)high[uVar16].m_c;
        *(undefined4 *)high[uVar16].m_c = uVar2;
      }
      if (uVar10 != 1) {
        auVar20[1] = SUB84(pbits[uVar16],0);
        auVar20[0] = SUB84(pbits[uVar16],4);
        pbits[uVar16] = auVar20;
        goto LAB_001627f0;
      }
    }
    uVar16 = uVar16 + 1;
    pcVar11 = pcVar11 + 1;
    pcVar15 = pcVar15 + 1;
  } while( true );
}

Assistant:

void encode_bc7_block(void* pBlock, const bc7_optimization_results* pResults)
	{
		const uint32_t best_mode = pResults->m_mode;

		const uint32_t total_subsets = g_bc7_num_subsets[best_mode];
		const uint32_t total_partitions = 1 << g_bc7_partition_bits[best_mode];
		//const uint32_t num_rotations = 1 << g_bc7_rotation_bits[best_mode];
		//const uint32_t num_index_selectors = (best_mode == 4) ? 2 : 1;

		const uint8_t* pPartition;
		if (total_subsets == 1)
			pPartition = &g_bc7_partition1[0];
		else if (total_subsets == 2)
			pPartition = &g_bc7_partition2[pResults->m_partition * 16];
		else
			pPartition = &g_bc7_partition3[pResults->m_partition * 16];

		uint8_t color_selectors[16];
		memcpy(color_selectors, pResults->m_selectors, 16);

		uint8_t alpha_selectors[16];
		memcpy(alpha_selectors, pResults->m_alpha_selectors, 16);

		color_quad_u8 low[3], high[3];
		memcpy(low, pResults->m_low, sizeof(low));
		memcpy(high, pResults->m_high, sizeof(high));

		uint32_t pbits[3][2];
		memcpy(pbits, pResults->m_pbits, sizeof(pbits));

		int anchor[3] = { -1, -1, -1 };

		for (uint32_t k = 0; k < total_subsets; k++)
		{
			uint32_t anchor_index = 0;
			if (k)
			{
				if ((total_subsets == 3) && (k == 1))
					anchor_index = g_bc7_table_anchor_index_third_subset_1[pResults->m_partition];
				else if ((total_subsets == 3) && (k == 2))
					anchor_index = g_bc7_table_anchor_index_third_subset_2[pResults->m_partition];
				else
					anchor_index = g_bc7_table_anchor_index_second_subset[pResults->m_partition];
			}

			anchor[k] = anchor_index;

			const uint32_t color_index_bits = get_bc7_color_index_size(best_mode, pResults->m_index_selector);
			const uint32_t num_color_indices = 1 << color_index_bits;

			if (color_selectors[anchor_index] & (num_color_indices >> 1))
			{
				for (uint32_t i = 0; i < 16; i++)
					if (pPartition[i] == k)
						color_selectors[i] = (uint8_t)((num_color_indices - 1) - color_selectors[i]);

				if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
				{
					for (uint32_t q = 0; q < 3; q++)
					{
						uint8_t t = low[k].m_c[q];
						low[k].m_c[q] = high[k].m_c[q];
						high[k].m_c[q] = t;
					}
				}
				else
				{
					color_quad_u8 tmp = low[k];
					low[k] = high[k];
					high[k] = tmp;
				}

				if (!g_bc7_mode_has_shared_p_bits[best_mode])
				{
					uint32_t t = pbits[k][0];
					pbits[k][0] = pbits[k][1];
					pbits[k][1] = t;
				}
			}

			if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
			{
				const uint32_t alpha_index_bits = get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);
				const uint32_t num_alpha_indices = 1 << alpha_index_bits;

				if (alpha_selectors[anchor_index] & (num_alpha_indices >> 1))
				{
					for (uint32_t i = 0; i < 16; i++)
						if (pPartition[i] == k)
							alpha_selectors[i] = (uint8_t)((num_alpha_indices - 1) - alpha_selectors[i]);

					uint8_t t = low[k].m_c[3];
					low[k].m_c[3] = high[k].m_c[3];
					high[k].m_c[3] = t;
				}
			}
		}

		uint8_t* pBlock_bytes = (uint8_t*)(pBlock);
		memset(pBlock_bytes, 0, BC7ENC_BLOCK_SIZE);

		uint32_t cur_bit_ofs = 0;
		bc7_set_block_bits(pBlock_bytes, 1 << best_mode, best_mode + 1, &cur_bit_ofs);

		if ((best_mode == 4) || (best_mode == 5))
			bc7_set_block_bits(pBlock_bytes, pResults->m_rotation, 2, &cur_bit_ofs);

		if (best_mode == 4)
			bc7_set_block_bits(pBlock_bytes, pResults->m_index_selector, 1, &cur_bit_ofs);

		if (total_partitions > 1)
			bc7_set_block_bits(pBlock_bytes, pResults->m_partition, (total_partitions == 64) ? 6 : 4, &cur_bit_ofs);

		const uint32_t total_comps = (best_mode >= 4) ? 4 : 3;
		for (uint32_t comp = 0; comp < total_comps; comp++)
		{
			for (uint32_t subset = 0; subset < total_subsets; subset++)
			{
				bc7_set_block_bits(pBlock_bytes, low[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
				bc7_set_block_bits(pBlock_bytes, high[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
			}
		}

		if (g_bc7_mode_has_p_bits[best_mode])
		{
			for (uint32_t subset = 0; subset < total_subsets; subset++)
			{
				bc7_set_block_bits(pBlock_bytes, pbits[subset][0], 1, &cur_bit_ofs);
				if (!g_bc7_mode_has_shared_p_bits[best_mode])
					bc7_set_block_bits(pBlock_bytes, pbits[subset][1], 1, &cur_bit_ofs);
			}
		}

		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				int idx = x + y * 4;

				uint32_t n = pResults->m_index_selector ? get_bc7_alpha_index_size(best_mode, pResults->m_index_selector) : get_bc7_color_index_size(best_mode, pResults->m_index_selector);

				if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
					n--;

				bc7_set_block_bits(pBlock_bytes, pResults->m_index_selector ? alpha_selectors[idx] : color_selectors[idx], n, &cur_bit_ofs);
			}
		}

		if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
		{
			for (uint32_t y = 0; y < 4; y++)
			{
				for (uint32_t x = 0; x < 4; x++)
				{
					int idx = x + y * 4;

					uint32_t n = pResults->m_index_selector ? get_bc7_color_index_size(best_mode, pResults->m_index_selector) : get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);

					if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
						n--;

					bc7_set_block_bits(pBlock_bytes, pResults->m_index_selector ? color_selectors[idx] : alpha_selectors[idx], n, &cur_bit_ofs);
				}
			}
		}

		assert(cur_bit_ofs == 128);
	}